

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 VmGetNextLine(SyString *pCursor,SyString *pCurrent)

{
  sxi32 sVar1;
  ushort **ppuVar2;
  bool bVar3;
  uint local_2c;
  char *pcStack_28;
  sxu32 nPos;
  char *zIn;
  SyString *pCurrent_local;
  SyString *pCursor_local;
  
  zIn = (char *)pCurrent;
  pCurrent_local = pCursor;
  while( true ) {
    bVar3 = false;
    if ((pCurrent_local->nByte != 0) && (bVar3 = false, (byte)*pCurrent_local->zString < 0xc0)) {
      ppuVar2 = __ctype_b_loc();
      bVar3 = ((*ppuVar2)[(int)*pCurrent_local->zString] & 0x2000) != 0;
    }
    if (!bVar3) break;
    pCurrent_local->nByte = pCurrent_local->nByte - 1;
    pCurrent_local->zString = pCurrent_local->zString + 1;
  }
  if (pCurrent_local->nByte == 0) {
    zIn[0] = '\0';
    zIn[1] = '\0';
    zIn[2] = '\0';
    zIn[3] = '\0';
    zIn[4] = '\0';
    zIn[5] = '\0';
    zIn[6] = '\0';
    zIn[7] = '\0';
    zIn[8] = '\0';
    zIn[9] = '\0';
    zIn[10] = '\0';
    zIn[0xb] = '\0';
    pCursor_local._4_4_ = -0x12;
  }
  else {
    pcStack_28 = pCurrent_local->zString;
    sVar1 = SyByteListFind(pCurrent_local->zString,pCurrent_local->nByte,"\r\n",&local_2c);
    if (sVar1 == 0) {
      *(char **)zIn = pcStack_28;
      *(uint *)(zIn + 8) = local_2c;
      pCurrent_local->zString = pcStack_28 + local_2c;
      pCurrent_local->nByte = pCurrent_local->nByte - local_2c;
      pCursor_local._4_4_ = 0;
    }
    else {
      *(char **)zIn = pCurrent_local->zString;
      *(uint *)(zIn + 8) = pCurrent_local->nByte;
      pCursor_local._4_4_ = -8;
    }
  }
  return pCursor_local._4_4_;
}

Assistant:

static sxi32 VmGetNextLine(SyString *pCursor, SyString *pCurrent)
{ 
  	const char *zIn;
  	sxu32 nPos; 
	/* Jump leading white spaces */
	SyStringLeftTrim(pCursor);
	if( pCursor->nByte < 1 ){
		SyStringInitFromBuf(pCurrent, 0, 0);
		return SXERR_EOF; /* End of input */
	}
	zIn = SyStringData(pCursor);
	if( SXRET_OK != SyByteListFind(pCursor->zString, pCursor->nByte, "\r\n", &nPos) ){
		/* Line not found, tell the caller to read more input from source */
		SyStringDupPtr(pCurrent, pCursor);
		return SXERR_MORE;
	}
  	pCurrent->zString = zIn;
  	pCurrent->nByte	= nPos;	
  	/* advance the cursor so we can call this routine again */
  	pCursor->zString = &zIn[nPos];
  	pCursor->nByte -= nPos;
  	return SXRET_OK;
 }